

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::MergingIterator::Prev(MergingIterator *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  IteratorWrapper *this_00;
  undefined4 extraout_var;
  Slice local_30;
  IteratorWrapper *local_20;
  IteratorWrapper *child;
  MergingIterator *pMStack_10;
  int i;
  MergingIterator *this_local;
  
  pMStack_10 = this;
  uVar2 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((uVar2 & 1) != 0) {
    if (this->direction_ != kReverse) {
      for (child._4_4_ = 0; child._4_4_ < this->n_; child._4_4_ = child._4_4_ + 1) {
        this_00 = this->children_ + child._4_4_;
        local_20 = this_00;
        if (this_00 != this->current_) {
          iVar3 = (*(this->super_Iterator)._vptr_Iterator[8])();
          local_30.data_ = (char *)CONCAT44(extraout_var,iVar3);
          IteratorWrapper::Seek(this_00,&local_30);
          bVar1 = IteratorWrapper::Valid(local_20);
          if (bVar1) {
            IteratorWrapper::Prev(local_20);
          }
          else {
            IteratorWrapper::SeekToLast(local_20);
          }
        }
      }
      this->direction_ = kReverse;
    }
    IteratorWrapper::Prev(this->current_);
    FindLargest(this);
    return;
  }
  __assert_fail("Valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/merger.cc"
                ,0x52,"virtual void leveldb::(anonymous namespace)::MergingIterator::Prev()");
}

Assistant:

void Prev() override {
    assert(Valid());

    // Ensure that all children are positioned before key().
    // If we are moving in the reverse direction, it is already
    // true for all of the non-current_ children since current_ is
    // the largest child and key() == current_->key().  Otherwise,
    // we explicitly position the non-current_ children.
    if (direction_ != kReverse) {
      for (int i = 0; i < n_; i++) {
        IteratorWrapper* child = &children_[i];
        if (child != current_) {
          child->Seek(key());
          if (child->Valid()) {
            // Child is at first entry >= key().  Step back one to be < key()
            child->Prev();
          } else {
            // Child has no entries >= key().  Position at last entry.
            child->SeekToLast();
          }
        }
      }
      direction_ = kReverse;
    }

    current_->Prev();
    FindLargest();
  }